

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

CURLcode cf_h2_cntrl(Curl_cfilter *cf,Curl_easy *data,int event,int arg1,void *arg2)

{
  long *plVar1;
  long lVar2;
  nghttp2_session *session;
  HTTP *pHVar3;
  stream_ctx *psVar4;
  uint error_code;
  size_t sVar5;
  char *pcVar6;
  cf_h2_ctx *ctx;
  CURLcode CVar7;
  CURLcode CVar8;
  
  plVar1 = (long *)cf->ctx;
  lVar2 = plVar1[2];
  plVar1[2] = (long)data;
  CVar7 = CURLE_OK;
  CVar8 = CURLE_OK;
  if (event - 2U < 7) {
    CVar8 = CVar7;
    switch(event) {
    case 2:
    case 7:
      http2_data_done(cf,data,(_Bool)((char)(&switchD_007105db::switchdataD_00976f78)[event - 2U] +
                                     'x'));
      break;
    case 6:
      if ((data != (Curl_easy *)0x0) && (pHVar3 = (data->req).p.http, pHVar3 != (HTTP *)0x0)) {
        psVar4 = (stream_ctx *)pHVar3->h2_ctx;
        session = (nghttp2_session *)*plVar1;
        if (psVar4 != (stream_ctx *)0x0 && session != (nghttp2_session *)0x0) {
          if (arg1 == 0) {
            CVar8 = CURLE_OK;
            error_code = nghttp2_session_set_local_window_size
                                   (session,'\0',psVar4->id,psVar4->local_window_size);
            if (error_code == 0) {
              drain_stream(cf,data,psVar4);
              h2_progress_egress(cf,data);
              drain_stream(cf,data,psVar4);
              Curl_expire(data,0,EXPIRE_RUN_NOW);
              break;
            }
          }
          else {
            CVar8 = CURLE_OK;
            error_code = nghttp2_session_set_local_window_size(session,'\0',psVar4->id,0);
            if (error_code == 0) {
              h2_progress_egress(cf,data);
              break;
            }
          }
          pcVar6 = nghttp2_strerror(error_code);
          Curl_failf(data,"nghttp2_session_set_local_window_size() failed: %s(%d)",pcVar6,
                     (ulong)error_code);
          CVar8 = CURLE_HTTP2;
        }
      }
      break;
    case 8:
      if (((data != (Curl_easy *)0x0) && (pHVar3 = (data->req).p.http, pHVar3 != (HTTP *)0x0)) &&
         (psVar4 = (stream_ctx *)pHVar3->h2_ctx, psVar4 != (stream_ctx *)0x0 && *plVar1 != 0)) {
        if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"[%d] data done send",(ulong)(uint)psVar4->id);
        }
        if ((psVar4->send_closed == false) && (psVar4->send_closed = true, psVar4->upload_left != 0)
           ) {
          sVar5 = Curl_bufq_len(&psVar4->sendbuf);
          psVar4->upload_left = sVar5;
          nghttp2_session_resume_data((nghttp2_session *)*plVar1,psVar4->id);
          drain_stream(cf,data,psVar4);
        }
      }
    }
  }
  *(long *)((long)cf->ctx + 0x10) = lVar2;
  return CVar8;
}

Assistant:

static CURLcode cf_h2_cntrl(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int event, int arg1, void *arg2)
{
  CURLcode result = CURLE_OK;
  struct cf_call_data save;

  (void)arg2;

  CF_DATA_SAVE(save, cf, data);
  switch(event) {
  case CF_CTRL_DATA_SETUP:
    break;
  case CF_CTRL_DATA_PAUSE:
    result = http2_data_pause(cf, data, (arg1 != 0));
    break;
  case CF_CTRL_DATA_DONE_SEND:
    result = http2_data_done_send(cf, data);
    break;
  case CF_CTRL_DATA_DETACH:
    http2_data_done(cf, data, TRUE);
    break;
  case CF_CTRL_DATA_DONE:
    http2_data_done(cf, data, arg1 != 0);
    break;
  default:
    break;
  }
  CF_DATA_RESTORE(cf, save);
  return result;
}